

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_tests.cpp
# Opt level: O0

void __thiscall skiplist_tests::getlocator_test::test_method(getlocator_test *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  uint64_t uVar6;
  CBlockIndex *pCVar7;
  reference pvVar8;
  long in_FS_OFFSET;
  uint i_3;
  uint i_2;
  CBlockIndex *tip;
  int r;
  int n;
  uint i_1;
  uint i;
  uint dist;
  CBlockLocator locator;
  CChain chain;
  vector<CBlockIndex,_std::allocator<CBlockIndex>_> vBlocksSide;
  vector<uint256,_std::allocator<uint256>_> vHashSide;
  vector<CBlockIndex,_std::allocator<CBlockIndex>_> vBlocksMain;
  vector<uint256,_std::allocator<uint256>_> vHashMain;
  char *in_stack_fffffffffffff7b8;
  lazy_ostream *in_stack_fffffffffffff7c0;
  char *in_stack_fffffffffffff7c8;
  CBlockIndex *in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d8;
  int in_stack_fffffffffffff7dc;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffff7e0;
  CBlockIndex *in_stack_fffffffffffff7e8;
  lazy_ostream *in_stack_fffffffffffff7f0;
  unit_test_log_t *in_stack_fffffffffffff7f8;
  reference local_780;
  reference local_698;
  uint local_664;
  uint local_65c;
  int local_648;
  uint local_640;
  uint local_638;
  undefined1 local_618 [16];
  undefined1 local_608 [64];
  undefined1 local_5c8 [8];
  uint64_t local_5c0;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [64];
  const_string local_568 [2];
  lazy_ostream local_548 [2];
  assertion_result local_528 [2];
  const_string local_4f0 [2];
  lazy_ostream local_4d0 [2];
  assertion_result local_4b0 [4];
  const_string local_448 [2];
  lazy_ostream local_428 [2];
  assertion_result local_408 [2];
  undefined4 local_3cc;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [128];
  const_string local_338 [2];
  lazy_ostream local_318 [2];
  assertion_result local_2f8 [2];
  undefined4 local_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [512];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<uint256>::allocator((allocator<uint256> *)in_stack_fffffffffffff7b8);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7e8,
             (size_type)in_stack_fffffffffffff7e0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
  std::allocator<uint256>::~allocator((allocator<uint256> *)in_stack_fffffffffffff7b8);
  std::allocator<CBlockIndex>::allocator((allocator<CBlockIndex> *)in_stack_fffffffffffff7b8);
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::vector
            ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff7e8,
             (size_type)in_stack_fffffffffffff7e0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
  std::allocator<CBlockIndex>::~allocator((allocator<CBlockIndex> *)in_stack_fffffffffffff7b8);
  for (local_638 = 0;
      sVar3 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::size
                        ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                         in_stack_fffffffffffff7b8), local_638 < sVar3; local_638 = local_638 + 1) {
    arith_uint256::arith_uint256((arith_uint256 *)in_stack_fffffffffffff7b8,0xae6921);
    ArithToUint256((arith_uint256 *)in_stack_fffffffffffff7c8);
    pvVar4 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7c8,
                        (size_type)in_stack_fffffffffffff7c0);
    *(undefined8 *)(pvVar4->super_base_blob<256U>).m_data._M_elems = local_28;
    *(undefined8 *)((pvVar4->super_base_blob<256U>).m_data._M_elems + 8) = local_20;
    *(undefined8 *)((pvVar4->super_base_blob<256U>).m_data._M_elems + 0x10) = local_18;
    *(undefined8 *)((pvVar4->super_base_blob<256U>).m_data._M_elems + 0x18) = local_10;
    pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                       ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                        in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
    pvVar5->nHeight = local_638;
    if (local_638 == 0) {
      local_698 = (reference)0x0;
    }
    else {
      local_698 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                            ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                             in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
    }
    pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                       ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                        in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
    pvVar5->pprev = local_698;
    pvVar4 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7c8,
                        (size_type)in_stack_fffffffffffff7c0);
    pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                       ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                        in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
    pvVar5->phashBlock = pvVar4;
    std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
              ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff7c8,
               (size_type)in_stack_fffffffffffff7c0);
    CBlockIndex::BuildSkip((CBlockIndex *)in_stack_fffffffffffff7c8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff7f8,(const_string *)in_stack_fffffffffffff7f0,
                 (size_t)in_stack_fffffffffffff7e8,(const_string *)in_stack_fffffffffffff7e0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffff7c0,(char (*) [1])in_stack_fffffffffffff7b8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff7c8,
                 (size_type)in_stack_fffffffffffff7c0);
      CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff7c8);
      UintToArith256((uint256 *)in_stack_fffffffffffff7d0);
      uVar6 = base_uint<256U>::GetLow64((base_uint<256U> *)in_stack_fffffffffffff7b8);
      local_2bc = (undefined4)uVar6;
      pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                         ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                          in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
      in_stack_fffffffffffff7c0 = (lazy_ostream *)&pvVar5->nHeight;
      in_stack_fffffffffffff7c8 = "vBlocksMain[i].nHeight";
      in_stack_fffffffffffff7b8 = "(int)UintToArith256(vBlocksMain[i].GetBlockHash()).GetLow64()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
                (local_2a8,local_2b8,0x39,1,2);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff7b8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff7f8,(const_string *)in_stack_fffffffffffff7f0,
                 (size_t)in_stack_fffffffffffff7e8,(const_string *)in_stack_fffffffffffff7e0);
      pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                         ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                          in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
      if (pvVar5->pprev != (CBlockIndex *)0x0) {
        std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                  ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff7c8,
                   (size_type)in_stack_fffffffffffff7c0);
        std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                  ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff7c8,
                   (size_type)in_stack_fffffffffffff7c0);
      }
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff7c8,
                 SUB81((ulong)in_stack_fffffffffffff7c0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      boost::unit_test::operator<<
                (in_stack_fffffffffffff7c0,(basic_cstring<const_char> *)in_stack_fffffffffffff7b8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      in_stack_fffffffffffff7b8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2f8,local_318,local_338,0x3a,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff7b8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff7b8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  std::allocator<uint256>::allocator((allocator<uint256> *)in_stack_fffffffffffff7b8);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7e8,
             (size_type)in_stack_fffffffffffff7e0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
  std::allocator<uint256>::~allocator((allocator<uint256> *)in_stack_fffffffffffff7b8);
  std::allocator<CBlockIndex>::allocator((allocator<CBlockIndex> *)in_stack_fffffffffffff7b8);
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::vector
            ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff7e8,
             (size_type)in_stack_fffffffffffff7e0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
  std::allocator<CBlockIndex>::~allocator((allocator<CBlockIndex> *)in_stack_fffffffffffff7b8);
  for (local_640 = 0;
      sVar3 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::size
                        ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                         in_stack_fffffffffffff7b8), local_640 < sVar3; local_640 = local_640 + 1) {
    base_uint<256U>::base_uint
              ((base_uint<256U> *)in_stack_fffffffffffff7c8,(uint64_t)in_stack_fffffffffffff7c0);
    arith_uint256::arith_uint256((arith_uint256 *)in_stack_fffffffffffff7b8,0xae6fdc);
    ::operator<<((base_uint<256U> *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7dc);
    ::operator+((base_uint<256U> *)in_stack_fffffffffffff7e0,
                (base_uint<256U> *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
    arith_uint256::arith_uint256
              ((arith_uint256 *)in_stack_fffffffffffff7b8,(base_uint<256U> *)0xae702e);
    ArithToUint256((arith_uint256 *)in_stack_fffffffffffff7c8);
    pvVar4 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7c8,
                        (size_type)in_stack_fffffffffffff7c0);
    *(undefined8 *)(pvVar4->super_base_blob<256U>).m_data._M_elems = local_a8;
    *(undefined8 *)((pvVar4->super_base_blob<256U>).m_data._M_elems + 8) = local_a0;
    *(undefined8 *)((pvVar4->super_base_blob<256U>).m_data._M_elems + 0x10) = local_98;
    *(undefined8 *)((pvVar4->super_base_blob<256U>).m_data._M_elems + 0x18) = local_90;
    pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                       ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                        in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
    pvVar5->nHeight = local_640 + 50000;
    if (local_640 == 0) {
      pCVar7 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::data
                         ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                          in_stack_fffffffffffff7b8);
      pvVar5 = pCVar7 + 49999;
    }
    else {
      pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                         ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                          in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
    }
    pvVar8 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                       ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                        in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
    pvVar8->pprev = pvVar5;
    pvVar4 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7c8,
                        (size_type)in_stack_fffffffffffff7c0);
    pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                       ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                        in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
    pvVar5->phashBlock = pvVar4;
    std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
              ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff7c8,
               (size_type)in_stack_fffffffffffff7c0);
    CBlockIndex::BuildSkip((CBlockIndex *)in_stack_fffffffffffff7c8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff7f8,(const_string *)in_stack_fffffffffffff7f0,
                 (size_t)in_stack_fffffffffffff7e8,(const_string *)in_stack_fffffffffffff7e0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffff7c0,(char (*) [1])in_stack_fffffffffffff7b8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff7c8,
                 (size_type)in_stack_fffffffffffff7c0);
      CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff7c8);
      UintToArith256((uint256 *)in_stack_fffffffffffff7d0);
      uVar6 = base_uint<256U>::GetLow64((base_uint<256U> *)in_stack_fffffffffffff7b8);
      local_3cc = (undefined4)uVar6;
      pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                         ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                          in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
      in_stack_fffffffffffff7c0 = (lazy_ostream *)&pvVar5->nHeight;
      in_stack_fffffffffffff7c8 = "vBlocksSide[i].nHeight";
      in_stack_fffffffffffff7b8 = "(int)UintToArith256(vBlocksSide[i].GetBlockHash()).GetLow64()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
                (local_3b8,local_3c8,0x46,1,2);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff7b8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff7f8,(const_string *)in_stack_fffffffffffff7f0,
                 (size_t)in_stack_fffffffffffff7e8,(const_string *)in_stack_fffffffffffff7e0);
      pvVar5 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                         ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                          in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
      if (pvVar5->pprev != (CBlockIndex *)0x0) {
        std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                  ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff7c8,
                   (size_type)in_stack_fffffffffffff7c0);
        std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                  ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff7c8,
                   (size_type)in_stack_fffffffffffff7c0);
      }
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff7c8,
                 SUB81((ulong)in_stack_fffffffffffff7c0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      boost::unit_test::operator<<
                (in_stack_fffffffffffff7c0,(basic_cstring<const_char> *)in_stack_fffffffffffff7b8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      in_stack_fffffffffffff7b8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_408,local_428,local_448,0x47,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff7b8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff7b8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  CChain::CChain((CChain *)in_stack_fffffffffffff7b8);
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::back
            ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff7b8);
  CChain::SetTip((CChain *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                 in_stack_fffffffffffff7d0);
  for (local_648 = 0; local_648 < 100; local_648 = local_648 + 1) {
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7dc);
    if (iVar2 < 100000) {
      local_780 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                            ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                             in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
    }
    else {
      local_780 = std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                            ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)
                             in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
    }
    GetLocator(in_stack_fffffffffffff7e8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff7f8,(const_string *)in_stack_fffffffffffff7f0,
                 (size_t)in_stack_fffffffffffff7e8,(const_string *)in_stack_fffffffffffff7e0);
      std::vector<uint256,_std::allocator<uint256>_>::front
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7c0);
      CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff7c8);
      ::operator==((base_blob<256U> *)in_stack_fffffffffffff7c8,
                   (base_blob<256U> *)in_stack_fffffffffffff7c0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff7c8,
                 SUB81((ulong)in_stack_fffffffffffff7c0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      boost::unit_test::operator<<
                (in_stack_fffffffffffff7c0,(basic_cstring<const_char> *)in_stack_fffffffffffff7b8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      in_stack_fffffffffffff7b8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_4b0,local_4d0,local_4f0,0x55,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff7b8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff7b8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff7f8,(const_string *)in_stack_fffffffffffff7f0,
                 (size_t)in_stack_fffffffffffff7e8,(const_string *)in_stack_fffffffffffff7e0);
      std::vector<uint256,_std::allocator<uint256>_>::back
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7b8);
      std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::operator[]
                ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff7c8,
                 (size_type)in_stack_fffffffffffff7c0);
      CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff7c8);
      ::operator==((base_blob<256U> *)in_stack_fffffffffffff7c8,
                   (base_blob<256U> *)in_stack_fffffffffffff7c0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff7c8,
                 SUB81((ulong)in_stack_fffffffffffff7c0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      boost::unit_test::operator<<
                (in_stack_fffffffffffff7c0,(basic_cstring<const_char> *)in_stack_fffffffffffff7b8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                 (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
      in_stack_fffffffffffff7b8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_528,local_548,local_568,0x56,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff7b8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff7b8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    local_65c = 1;
    while( true ) {
      bVar1 = false;
      if (local_65c < 0xc) {
        sVar3 = std::vector<uint256,_std::allocator<uint256>_>::size
                          ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7b8);
        bVar1 = (ulong)local_65c < sVar3 - 1;
      }
      if (!bVar1) break;
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                   (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff7f8,(const_string *)in_stack_fffffffffffff7f0,
                   (size_t)in_stack_fffffffffffff7e8,(const_string *)in_stack_fffffffffffff7e0);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_fffffffffffff7c0,(char (*) [1])in_stack_fffffffffffff7b8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                   (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
        std::vector<uint256,_std::allocator<uint256>_>::operator[]
                  ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7c8,
                   (size_type)in_stack_fffffffffffff7c0);
        UintToArith256((uint256 *)in_stack_fffffffffffff7d0);
        local_5c0 = base_uint<256U>::GetLow64((base_uint<256U> *)in_stack_fffffffffffff7b8);
        local_5c8._4_4_ = local_780->nHeight - local_65c;
        in_stack_fffffffffffff7c8 = "tip->nHeight - i";
        in_stack_fffffffffffff7c0 = (lazy_ostream *)(local_5c8 + 4);
        in_stack_fffffffffffff7b8 = "UintToArith256(locator.vHave[i]).GetLow64()";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                  (local_5a8,local_5b8,0x5a,1,2);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffff7b8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      local_65c = local_65c + 1;
    }
    local_5c8._0_4_ = 2;
    for (local_664 = 0xc;
        sVar3 = std::vector<uint256,_std::allocator<uint256>_>::size
                          ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7b8),
        (ulong)local_664 < sVar3 - 1; local_664 = local_664 + 1) {
      do {
        in_stack_fffffffffffff7f8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                   (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff7b8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff7f8,(const_string *)in_stack_fffffffffffff7f0,
                   (size_t)in_stack_fffffffffffff7e8,(const_string *)in_stack_fffffffffffff7e0);
        in_stack_fffffffffffff7f0 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_fffffffffffff7c0,(char (*) [1])in_stack_fffffffffffff7b8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff7c8,
                   (pointer)in_stack_fffffffffffff7c0,(unsigned_long)in_stack_fffffffffffff7b8);
        std::vector<uint256,_std::allocator<uint256>_>::operator[]
                  ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7c8,
                   (size_type)in_stack_fffffffffffff7c0);
        UintToArith256((uint256 *)in_stack_fffffffffffff7d0);
        in_stack_fffffffffffff7e8 =
             (CBlockIndex *)base_uint<256U>::GetLow64((base_uint<256U> *)in_stack_fffffffffffff7b8);
        std::vector<uint256,_std::allocator<uint256>_>::operator[]
                  ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7c8,
                   (size_type)in_stack_fffffffffffff7c0);
        UintToArith256((uint256 *)in_stack_fffffffffffff7d0);
        in_stack_fffffffffffff7e0 =
             (RandomMixin<FastRandomContext> *)
             base_uint<256U>::GetLow64((base_uint<256U> *)in_stack_fffffffffffff7b8);
        in_stack_fffffffffffff7c8 = "dist";
        in_stack_fffffffffffff7c0 = (lazy_ostream *)local_5c8;
        in_stack_fffffffffffff7b8 =
             "UintToArith256(locator.vHave[i - 1]).GetLow64() - UintToArith256(locator.vHave[i]).GetLow64()"
        ;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                  (local_608,local_618,0x60,1,2);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffff7b8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
        in_stack_fffffffffffff7dc = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7dc);
      } while (bVar1);
      local_5c8._0_4_ = local_5c8._0_4_ << 1;
    }
    CBlockLocator::~CBlockLocator((CBlockLocator *)in_stack_fffffffffffff7b8);
  }
  CChain::~CChain((CChain *)in_stack_fffffffffffff7b8);
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::~vector
            ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff7c8);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7c8);
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::~vector
            ((vector<CBlockIndex,_std::allocator<CBlockIndex>_> *)in_stack_fffffffffffff7c8);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7c8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(getlocator_test)
{
    // Build a main chain 100000 blocks long.
    std::vector<uint256> vHashMain(100000);
    std::vector<CBlockIndex> vBlocksMain(100000);
    for (unsigned int i=0; i<vBlocksMain.size(); i++) {
        vHashMain[i] = ArithToUint256(i); // Set the hash equal to the height, so we can quickly check the distances.
        vBlocksMain[i].nHeight = i;
        vBlocksMain[i].pprev = i ? &vBlocksMain[i - 1] : nullptr;
        vBlocksMain[i].phashBlock = &vHashMain[i];
        vBlocksMain[i].BuildSkip();
        BOOST_CHECK_EQUAL((int)UintToArith256(vBlocksMain[i].GetBlockHash()).GetLow64(), vBlocksMain[i].nHeight);
        BOOST_CHECK(vBlocksMain[i].pprev == nullptr || vBlocksMain[i].nHeight == vBlocksMain[i].pprev->nHeight + 1);
    }

    // Build a branch that splits off at block 49999, 50000 blocks long.
    std::vector<uint256> vHashSide(50000);
    std::vector<CBlockIndex> vBlocksSide(50000);
    for (unsigned int i=0; i<vBlocksSide.size(); i++) {
        vHashSide[i] = ArithToUint256(i + 50000 + (arith_uint256(1) << 128)); // Add 1<<128 to the hashes, so GetLow64() still returns the height.
        vBlocksSide[i].nHeight = i + 50000;
        vBlocksSide[i].pprev = i ? &vBlocksSide[i - 1] : (vBlocksMain.data()+49999);
        vBlocksSide[i].phashBlock = &vHashSide[i];
        vBlocksSide[i].BuildSkip();
        BOOST_CHECK_EQUAL((int)UintToArith256(vBlocksSide[i].GetBlockHash()).GetLow64(), vBlocksSide[i].nHeight);
        BOOST_CHECK(vBlocksSide[i].pprev == nullptr || vBlocksSide[i].nHeight == vBlocksSide[i].pprev->nHeight + 1);
    }

    // Build a CChain for the main branch.
    CChain chain;
    chain.SetTip(vBlocksMain.back());

    // Test 100 random starting points for locators.
    for (int n=0; n<100; n++) {
        int r = m_rng.randrange(150000);
        CBlockIndex* tip = (r < 100000) ? &vBlocksMain[r] : &vBlocksSide[r - 100000];
        CBlockLocator locator = GetLocator(tip);

        // The first result must be the block itself, the last one must be genesis.
        BOOST_CHECK(locator.vHave.front() == tip->GetBlockHash());
        BOOST_CHECK(locator.vHave.back() == vBlocksMain[0].GetBlockHash());

        // Entries 1 through 11 (inclusive) go back one step each.
        for (unsigned int i = 1; i < 12 && i < locator.vHave.size() - 1; i++) {
            BOOST_CHECK_EQUAL(UintToArith256(locator.vHave[i]).GetLow64(), tip->nHeight - i);
        }

        // The further ones (excluding the last one) go back with exponential steps.
        unsigned int dist = 2;
        for (unsigned int i = 12; i < locator.vHave.size() - 1; i++) {
            BOOST_CHECK_EQUAL(UintToArith256(locator.vHave[i - 1]).GetLow64() - UintToArith256(locator.vHave[i]).GetLow64(), dist);
            dist *= 2;
        }
    }
}